

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QByteArray * __thiscall Moc::toFullyQualified(Moc *this,QByteArray *name)

{
  long lVar1;
  bool bVar2;
  QByteArray *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator it_1;
  const_iterator it;
  QByteArray *in_stack_ffffffffffffff88;
  const_iterator *in_stack_ffffffffffffff90;
  QByteArray *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QByteArray,_QByteArray>::find
            ((QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QHash<QByteArray,_QByteArray>::end((QHash<QByteArray,_QByteArray> *)in_RDI);
  bVar2 = QHash<QByteArray,_QByteArray>::const_iterator::operator!=
                    (in_RDI,in_stack_ffffffffffffff90);
  if (bVar2) {
    local_50 = QHash<QByteArray,_QByteArray>::const_iterator::value((const_iterator *)0x14ae27);
  }
  else {
    QHash<QByteArray,_QByteArray>::find
              ((QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
    ;
    QHash<QByteArray,_QByteArray>::end((QHash<QByteArray,_QByteArray> *)in_RDI);
    bVar2 = QHash<QByteArray,_QByteArray>::const_iterator::operator!=
                      (in_RDI,in_stack_ffffffffffffff90);
    local_50 = in_RSI;
    if (bVar2) {
      local_50 = QHash<QByteArray,_QByteArray>::const_iterator::value((const_iterator *)0x14aea3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

const QByteArray &Moc::toFullyQualified(const QByteArray &name) const noexcept
{
    if (auto it = knownQObjectClasses.find(name); it != knownQObjectClasses.end())
        return it.value();
    if (auto it = knownGadgets.find(name); it != knownGadgets.end())
        return it.value();
    return name;
}